

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-str_utils.c
# Opt level: O0

void CGTFS_StrUtils(void)

{
  int iVar1;
  greatest_test_res local_c;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("str_utils_filename_no_ext");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = str_utils_filename_no_ext();
    }
    greatest_test_post(local_c);
  }
  return;
}

Assistant:

SUITE(CGTFS_StrUtils) {
    RUN_TEST(str_utils_filename_no_ext);
}